

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moremagic.c
# Opt level: O2

void spell_worldbind(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    send_to_char("They are already bound to this world.\n\r",ch);
    return;
  }
  bVar1 = saves_spell(level + -5,(CHAR_DATA *)vo,9);
  if (bVar1) {
    act("You failed to bind $N to this world.",ch,(void *)0x0,vo,3);
    return;
  }
  act("You sever $N\'s ties to the spiritual world!",ch,(void *)0x0,vo,3);
  act("$n severs $N\'s ties to the spiritual world!",ch,(void *)0x0,vo,1);
  act_new("$n severs your ties to the spiritual world!",ch,(void *)0x0,vo,2,0);
  init_affect(&af);
  af.where = 0;
  af.aftype = 0;
  af.level = (short)level;
  af.duration = 3;
  af.location = 0;
  af.modifier = 0;
  af.type = (short)sn;
  affect_to_char((CHAR_DATA *)vo,&af);
  return;
}

Assistant:

void spell_worldbind(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("They are already bound to this world.\n\r", ch);
		return;
	}

	if (saves_spell(level - 5, victim, DAM_NEGATIVE))
	{
		act("You failed to bind $N to this world.", ch, 0, victim, TO_CHAR);
		return;
	}

	act("You sever $N's ties to the spiritual world!", ch, 0, victim, TO_CHAR);
	act("$n severs $N's ties to the spiritual world!", ch, 0, victim, TO_NOTVICT);
	act_new("$n severs your ties to the spiritual world!", ch, 0, victim, TO_VICT, POS_DEAD);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = AFT_SPELL;
	af.level = level;
	af.duration = 3;
	af.location = 0;
	af.modifier = 0;
	affect_to_char(victim, &af);
}